

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void __thiscall FParser::NextToken(FParser *this)

{
  char *pcVar1;
  size_t sVar2;
  DFsSection *pDVar3;
  bool bVar4;
  tokentype_t local_28;
  FParser *this_local;
  
  if ((*this->Tokens[this->NumTokens + -1] != '\0') ||
     (this->TokenType[this->NumTokens + -1] == string_)) {
    this->NumTokens = this->NumTokens + 1;
    pcVar1 = this->Tokens[this->NumTokens + -2];
    sVar2 = strlen(this->Tokens[this->NumTokens + -2]);
    this->Tokens[this->NumTokens + -1] = pcVar1 + sVar2 + 1;
    *this->Tokens[this->NumTokens + -1] = '\0';
  }
  if ((*this->Rover != '\0') && ((*this->Rover == ' ' || (*this->Rover < ' ')))) {
    while( true ) {
      if ((*this->Rover == ' ') || (bVar4 = false, *this->Rover < ' ')) {
        bVar4 = *this->Rover != '\0';
      }
      if (!bVar4) break;
      this->Rover = this->Rover + 1;
    }
  }
  if (*this->Rover == '\0') {
    if (*this->Tokens[0] != '\0') {
      script_error("missing \';\'\n");
    }
  }
  else {
    if (((1 < this->NumTokens) && (*this->Rover == '(')) &&
       (this->TokenType[this->NumTokens + -2] == name_)) {
      this->TokenType[this->NumTokens + -2] = function;
    }
    if ((*this->Rover == '{') || (*this->Rover == '}')) {
      if (*this->Rover == '{') {
        this->BraceType = 0;
        pDVar3 = DFsScript::FindSectionStart(this->Script,this->Rover);
        this->Section = pDVar3;
      }
      else {
        this->BraceType = 1;
        pDVar3 = DFsScript::FindSectionEnd(this->Script,this->Rover);
        this->Section = pDVar3;
      }
      if (this->Section == (DFsSection *)0x0) {
        script_error("section not found!\n");
      }
    }
    else if (*this->Rover == ':') {
      this->NumTokens = 1;
      *this->Tokens[0] = '\0';
      this->TokenType[this->NumTokens + -1] = name_;
      this->Rover = this->Rover + 1;
    }
    else if (*this->Rover == '\"') {
      this->TokenType[this->NumTokens + -1] = string_;
      if (this->TokenType[this->NumTokens + -2] == string_) {
        this->NumTokens = this->NumTokens + -1;
      }
      this->Rover = this->Rover + 1;
    }
    else {
      bVar4 = isop((int)*this->Rover);
      if (bVar4) {
        local_28 = operator_;
      }
      else {
        if ((*this->Rover < '0') || (bVar4 = true, '9' < *this->Rover)) {
          bVar4 = *this->Rover == '.';
        }
        local_28 = (tokentype_t)bVar4;
      }
      this->TokenType[this->NumTokens + -1] = local_28;
    }
  }
  return;
}

Assistant:

void FParser::NextToken()
{
	if(Tokens[NumTokens-1][0] || TokenType[NumTokens-1]==string_)
    {
		NumTokens++;
		Tokens[NumTokens-1] = Tokens[NumTokens-2] + strlen(Tokens[NumTokens-2]) + 1;
		Tokens[NumTokens-1][0] = 0;
    }
	
	// get to the next token, ignoring spaces, newlines,
	// useless chars, comments etc
	
	while(1)
    {
		// empty whitespace
		if(*Rover && (*Rover==' ' || *Rover<32))
		{
			while((*Rover==' ' || *Rover<32) && *Rover) Rover++;
		}
		// end-of-script?
		if(!*Rover)
		{
			if(Tokens[0][0])
			{
				// line contains text, but no semicolon: an error
				script_error("missing ';'\n");
			}
			// empty line, end of command-list
			return;
		}
		break;  // otherwise
    }
	
	if(NumTokens>1 && *Rover == '(' && TokenType[NumTokens-2] == name_)
		TokenType[NumTokens-2] = function;
	
	if(*Rover == '{' || *Rover == '}')
    {
		if(*Rover == '{')
		{
			BraceType = bracket_open;
			Section = Script->FindSectionStart(Rover);
		}
		else            // closing brace
		{
			BraceType = bracket_close;
			Section = Script->FindSectionEnd(Rover);
		}
		if(!Section)
		{
			script_error("section not found!\n");
			return;
		}
    }
	else if(*Rover == ':')  // label
    {
		// ignore the label : reset
		NumTokens = 1;
		Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
		Rover++;        // ignore
    }
	else if(*Rover == '\"')
    {
		TokenType[NumTokens-1] = string_;
		if(TokenType[NumTokens-2] == string_) NumTokens--;   // join strings
		Rover++;
    }
	else
    {
		TokenType[NumTokens-1] = isop(*Rover) ? operator_ : isnum(*Rover) ? number : name_;
    }
}